

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg3.c
# Opt level: O0

_Bool borg_use_unknown(void)

{
  char *what;
  borg_item *item;
  wchar_t local_10;
  wchar_t n;
  wchar_t i;
  
  item._4_4_ = L'\xffffffff';
  for (local_10 = L'\0'; local_10 < (int)(uint)z_info->pack_size; local_10 = local_10 + L'\x01') {
    if (((borg_items[local_10].iqty != '\0') && (borg_items[local_10].tval == '\x16')) &&
       (borg_items[local_10].kind == 0)) {
      item._4_4_ = local_10;
    }
  }
  if (L'\xffffffff' < item._4_4_) {
    what = format("# Using unknown Staff %s.",borg_items + item._4_4_);
    borg_note(what);
    borg_zap_slot = item._4_4_;
    borg_keypress(0x75);
    borg_keypress((int)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"[item._4_4_]);
    borg_keypress(0xe000);
  }
  return L'\xffffffff' < item._4_4_;
}

Assistant:

bool borg_use_unknown(void)
{
    int i, n = -1;

    /* Scan the pack */
    for (i = 0; i < z_info->pack_size; i++) {
        borg_item* item = &borg_items[i];

        /* Skip empty items */
        if (!item->iqty)
            continue;

        /* Require correct tval */
        if (item->tval != TV_STAFF)
            continue;

        /* Skip aware items */
        if (item->kind)
            continue;

        /* Save this item */
        n = i;
    }

    /* None available */
    if (n < 0)
        return (false);

    /* Log the message */
    borg_note(format("# Using unknown Staff %s.", borg_items[n].desc));

    /* record the address to avoid certain bugs with inscriptions&amnesia */
    borg_zap_slot = n;

    /* Perform the action */
    borg_keypress('u');
    borg_keypress(all_letters_nohjkl[n]);

    /* Incase it is ID staff, ESCAPE out. */
    borg_keypress(ESCAPE);

    /* Success */
    return (true);
}